

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-h2.c
# Opt level: O1

int rops_check_upgrades_h2(lws *wsi)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  
  pcVar2 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HTTP_COLON_METHOD);
  iVar3 = 8;
  if (((wsi->vhost->h2).set.s[8] != 0) &&
     ((pcVar2 != (char *)0x0 & (byte)wsi->field_0x2dc >> 1) == 1)) {
    iVar1 = strcmp(pcVar2,"CONNECT");
    if (iVar1 == 0) {
      pcVar2 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_COLON_PROTOCOL);
      if (pcVar2 != (char *)0x0) {
        iVar1 = strcmp(pcVar2,"websocket");
        if (iVar1 == 0) {
          _lws_log(8,"Upgrade h2 to ws\n");
          lws_mux_mark_immortal(wsi);
          wsi->field_0x2dc = wsi->field_0x2dc | 0x10;
          iVar1 = lws_process_ws_upgrade(wsi);
          iVar3 = 9;
          if (iVar1 == 0) {
            _lws_log(8,"Upgraded h2 to ws OK\n");
            iVar3 = 7;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int
rops_check_upgrades_h2(struct lws *wsi)
{
#if defined(LWS_ROLE_WS)
	char *p;

	/*
	 * with H2 there's also a way to upgrade a stream to something
	 * else... :method is CONNECT and :protocol says the name of
	 * the new protocol we want to carry.  We have to have sent a
	 * SETTINGS saying that we support it though.
	 */
	p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_COLON_METHOD);
	if (!wsi->vhost->h2.set.s[H2SET_ENABLE_CONNECT_PROTOCOL] ||
	    !wsi->mux_substream || !p || strcmp(p, "CONNECT"))
		return LWS_UPG_RET_CONTINUE;

	p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_COLON_PROTOCOL);
	if (!p || strcmp(p, "websocket"))
		return LWS_UPG_RET_CONTINUE;

#if defined(LWS_WITH_SERVER_STATUS)
	wsi->vhost->conn_stats.ws_upg++;
#endif
	lwsl_info("Upgrade h2 to ws\n");
	lws_mux_mark_immortal(wsi);
	wsi->h2_stream_carries_ws = 1;

	if (lws_process_ws_upgrade(wsi))
		return LWS_UPG_RET_BAIL;

	lwsl_info("Upgraded h2 to ws OK\n");

	return LWS_UPG_RET_DONE;
#else
	return LWS_UPG_RET_CONTINUE;
#endif
}